

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.h
# Opt level: O2

void __thiscall
agge::renderer::operator()
          (renderer *this,bitmap<unsigned_char,_0UL,_0UL> *bitmap_,vector_i offset,rect_i *window,
          rasterizer<agge::tests::(anonymous_namespace)::passthrough_clipper<float>,_agge::scaling<float>_>
          *mask,blender<unsigned_char,_unsigned_char> *blender,
          simple_alpha<unsigned_char,_8UL> *alpha)

{
  const_cells_iterator pcVar1;
  short *psVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uchar *covers;
  const_cells_iterator pcVar6;
  int iVar7;
  int iVar8;
  const_cells_iterator pcVar9;
  int iVar10;
  int y;
  int iVar11;
  uchar *puVar12;
  uchar *buffer;
  uint count;
  scanline_cells sVar13;
  rendition_adapter ra;
  int local_84;
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  local_68;
  
  local_68._blender = (blender<unsigned_char,_unsigned_char> *)mask;
  local_68._offset = offset;
  local_68._window =
       adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
       ::make_window(bitmap_,offset,(rect_i *)0x0);
  local_68._bitmap = bitmap_;
  iVar4 = vector_rasterizer::width((vector_rasterizer *)window);
  covers = raw_memory_object::get<unsigned_char>(&this->_scanline_cache,iVar4 + 4);
  y = window[6].x1;
  iVar4 = (window[6].y2 - y) + 1;
  if (window[6].y2 < y) {
    iVar4 = 0;
  }
  iVar4 = iVar4 + y;
  do {
    if (iVar4 <= y) {
      return;
    }
    sVar13 = vector_rasterizer::operator[]((vector_rasterizer *)window,y);
    pcVar9 = sVar13.second;
    pcVar6 = sVar13.first;
    bVar3 = adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
            ::set_y(&local_68,y);
    if (bVar3) {
      if (pcVar6 == pcVar9) {
        iVar8 = 0;
        local_84 = 0;
      }
      else {
        iVar8 = 0;
        local_84 = 0;
        iVar11 = 0;
        puVar12 = covers;
LAB_0017707c:
        psVar2 = &pcVar6->x;
        iVar10 = (int)*psVar2;
        iVar5 = 0;
        pcVar1 = pcVar6;
        do {
          pcVar6 = pcVar1 + 1;
          iVar5 = iVar5 + pcVar1->area;
          iVar11 = pcVar1->cover + iVar11;
          if (pcVar6 == pcVar9) break;
          pcVar1 = pcVar6;
        } while (pcVar6->x == *psVar2);
        iVar7 = iVar11 * 0x200;
        if (iVar5 != 0) {
          iVar5 = iVar7 - iVar5 >> 9;
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          if (iVar8 != iVar10) {
            adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
            ::operator()(&local_68,local_84,iVar8 - local_84,covers);
            puVar12 = covers;
            iVar8 = iVar10;
            local_84 = iVar10;
          }
          iVar8 = iVar8 + 1;
          *puVar12 = (uchar)iVar5;
          puVar12 = puVar12 + 1;
          iVar10 = iVar10 + 1;
        }
        if (pcVar6 != pcVar9) {
          count = pcVar6->x - iVar10;
          if ((count != 0) && (iVar7 != 0)) {
            iVar5 = iVar7 >> 9;
            if (0xfe < iVar7 >> 9) {
              iVar5 = 0xff;
            }
            buffer = puVar12;
            if (iVar8 != iVar10) {
              adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
              ::operator()(&local_68,local_84,iVar8 - local_84,covers);
              buffer = covers;
              iVar8 = iVar10;
              local_84 = iVar10;
            }
            iVar8 = iVar8 + count;
            puVar12 = buffer + count;
            memset<unsigned_char>(buffer,(uchar)iVar5,count);
          }
          goto LAB_0017707c;
        }
      }
      adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
      ::operator()(&local_68,local_84,iVar8 - local_84,covers);
    }
    y = y + 1;
  } while( true );
}

Assistant:

inline void renderer::operator ()(BitmapT &bitmap_, vector_i offset, const rect_i *window, const MaskT &mask, const BlenderT &blender,
		const AlphaFn &alpha)
	{
		typedef adapter<BitmapT, BlenderT> rendition_adapter;

		rendition_adapter ra(bitmap_, offset, window, blender);
		scanline_adapter<rendition_adapter> scanline(ra, _scanline_cache, mask.width());

		render(scanline, mask, alpha, 0, 1);
	}